

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::ReadAllBoardsBroadcast(BasePort *this)

{
  double *pdVar1;
  double dVar2;
  uchar *puVar3;
  BoardIO *pBVar4;
  long lVar5;
  BroadcastBoardInfo *pBVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined7 uVar14;
  ostream *poVar11;
  uint *puVar12;
  long lVar13;
  bool bVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  bool *pbVar19;
  uint *__s;
  ulong uVar20;
  double extraout_XMM0_Qa;
  double dVar21;
  double dVar22;
  uint local_78;
  allocator<char> local_71;
  double local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  BroadcastBoardInfo *local_58;
  string local_50 [32];
  
  iVar8 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar8 == '\0') {
    poVar11 = this->outStr;
    pcVar18 = "BasePort::ReadAllBoardsBroadcast: port not initialized";
LAB_0011033f:
    poVar11 = std::operator<<(poVar11,pcVar18);
  }
  else {
    if (((this->IsAllBoardsRev4_6_ == false) && (this->IsAllBoardsRev7_ == false)) &&
       (this->IsAllBoardsRev8_9_ == false)) {
      poVar11 = this->outStr;
      pcVar18 = "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware";
      goto LAB_0011033f;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_50,"ReadAllBoardsBroadcast",&local_71);
    iVar8 = (*this->_vptr_BasePort[0x1b])(this,local_50,(ulong)this->autoReScan);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar8 == '\0') {
LAB_0011034e:
      SetReadInvalid(this);
      goto LAB_00110356;
    }
    uVar17 = (this->bcReadInfo).readSequence + 1;
    if (uVar17 == 0x10000) {
      uVar17 = 1;
    }
    (this->bcReadInfo).readSequence = uVar17;
    iVar8 = (*this->_vptr_BasePort[0x29])(this);
    if ((char)iVar8 != '\0') {
      (*this->_vptr_BasePort[0x2a])(this);
      BroadcastReadInfo::PrepareForRead(&this->bcReadInfo);
      puVar3 = this->ReadBufferBroadcast;
      uVar17 = (*this->_vptr_BasePort[0x18])(this);
      uVar9 = (*this->_vptr_BasePort[0x14])(this);
      __s = (uint *)(puVar3 + (ulong)uVar9 + (ulong)uVar17);
      uVar16 = 0;
      memset(__s,0,(ulong)(this->bcReadInfo).readSizeQuads << 2);
      iVar8 = (*this->_vptr_BasePort[0x2b])(this,__s,(ulong)((this->bcReadInfo).readSizeQuads << 2))
      ;
      if ((char)iVar8 != '\0') {
        (*this->_vptr_BasePort[0x20])(this);
        local_58 = (this->bcReadInfo).boardInfo;
        uVar14 = (undefined7)((ulong)local_58 >> 8);
        local_60 = (uint)CONCAT71(uVar14,1);
        local_78 = 0;
        local_68 = (uint)CONCAT71(uVar14,1);
        local_70 = extraout_XMM0_Qa;
LAB_00110019:
        uVar17 = (uint)uVar16;
        if ((uVar17 < 0x10) && (local_78 < this->NumOfBoards_)) {
          if ((*__s == 0) || (__s[2] == 0)) {
            poVar11 = std::operator<<(this->outStr,
                                      "BasePort::ReadAllBoardsBroadcast: invalid block after reading "
                                     );
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11," boards");
            std::endl<char,std::char_traits<char>>(poVar11);
            std::operator<<(this->outStr,"Failed to read from board(s) ");
            pbVar19 = &(this->bcReadInfo).boardInfo[0].updated;
            for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
              if ((((BroadcastBoardInfo *)(pbVar19 + -1))->inUse == true) && (*pbVar19 == false)) {
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)this->outStr);
                std::operator<<(poVar11," ");
              }
              pbVar19 = pbVar19 + 0x20;
            }
            poVar11 = this->outStr;
          }
          else {
            uVar9 = __s[2] << 0x18;
            if (((uVar9 & 0xf0000000) == 0x40000000) || (this->IsAllBoardsRev8_9_ != false)) {
              uVar9 = (uVar9 & 0xf000000) >> 0x18;
              iVar8 = (*this->_vptr_BasePort[0x1f])(this);
              pBVar6 = local_58;
              uVar20 = (ulong)uVar9;
              if ((char)iVar8 != '\0') {
                uVar20 = uVar16;
              }
              pBVar4 = this->BoardList[uVar20];
              local_5c = uVar17;
              if (((uint)uVar20 == uVar9) || (pBVar4 == (BoardIO *)0x0)) goto LAB_00110098;
              poVar11 = std::operator<<(this->outStr,
                                        "BasePort::ReadAllBoardsBroadcast: board mismatch, expecting "
                                       );
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              poVar11 = std::operator<<(poVar11,", found ");
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            }
            else {
              poVar11 = std::operator<<(this->outStr,
                                        "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): "
                                       );
              *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
              poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
              *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                   *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 2;
            }
          }
          std::endl<char,std::char_traits<char>>(poVar11);
          goto LAB_001105da;
        }
        if ((local_68 & 1) == 0) {
LAB_001105da:
          for (lVar13 = 0x50; lVar13 != 0xd0; lVar13 = lVar13 + 8) {
            lVar5 = *(long *)((long)this->BoardList + lVar13 + -0x50);
            if (((lVar5 != 0) && (*(char *)((long)this->BoardList + lVar13 * 4 + -0x40) == '\x01'))
               && (*(char *)((long)this->BoardList + lVar13 * 4 + -0x3f) == '\0')) {
              *(undefined1 *)(lVar5 + 0x18) = 0;
              *(int *)(lVar5 + 0x1c) = *(int *)(lVar5 + 0x1c) + 1;
            }
          }
          (this->bcReadInfo).gapTime = 0.0;
          (this->bcReadInfo).readStartTime = 0.0;
          (this->bcReadInfo).readFinishTime = 0.0;
          bVar15 = false;
        }
        else if ((this->IsAllBoardsRev7_ != false) ||
                (bVar15 = true, this->IsAllBoardsRev8_9_ == true)) {
          uVar17 = *__s;
          dVar21 = (double)(((uVar17 & 0xff00) << 8 | uVar17 << 0x18) >> 0x10) * local_70;
          (this->bcReadInfo).readStartTime = dVar21;
          dVar22 = (double)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8) * local_70;
          (this->bcReadInfo).readFinishTime = dVar22;
          if (uVar17 == 0) {
            (this->bcReadInfo).gapTime = 0.0;
            bVar15 = true;
          }
          else {
            dVar2 = (this->bcReadInfo).updateFinishTime;
            if (dVar21 < dVar2) {
              dVar21 = dVar21 + *(double *)
                                 (&DAT_00118440 +
                                 (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) * local_70;
              (this->bcReadInfo).readStartTime = dVar21;
              (this->bcReadInfo).readOverflow = true;
            }
            if (dVar22 < dVar21) {
              (this->bcReadInfo).readFinishTime =
                   local_70 *
                   *(double *)
                    (&DAT_00118440 + (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) +
                   dVar22;
              (this->bcReadInfo).readOverflow = true;
            }
            dVar21 = dVar21 - dVar2;
            (this->bcReadInfo).gapTime = dVar21;
            if (dVar21 < (this->bcReadInfo).gapTimeMin) {
              (this->bcReadInfo).gapTimeMin = dVar21;
            }
            bVar15 = true;
            pdVar1 = &(this->bcReadInfo).gapTimeMax;
            if (*pdVar1 <= dVar21 && dVar21 != *pdVar1) {
              (this->bcReadInfo).gapTimeMax = dVar21;
            }
          }
        }
        if ((local_60 & 1) == 0) {
          return bVar15;
        }
        (*this->_vptr_BasePort[8])(this);
        return bVar15;
      }
      goto LAB_0011034e;
    }
    poVar11 = std::operator<<(this->outStr,
                              "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = "
                             );
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  }
  std::endl<char,std::char_traits<char>>(poVar11);
LAB_00110356:
  (*this->_vptr_BasePort[8])(this);
  return false;
LAB_00110098:
  if ((pBVar4 == (BoardIO *)0x0) || (local_58[uVar20].inUse == false)) {
    puVar12 = __s + 0x11;
    if (this->IsAllBoardsRev4_6_ == false) {
      puVar12 = __s;
    }
  }
  else {
    local_58[uVar20].updated = true;
    local_58[uVar20].blockNum = local_78;
    uVar9 = (*__s & 0xff00) << 8;
    uVar10 = (uVar9 | *__s << 0x18) >> 0x10;
    local_58[uVar20].sequence = uVar10;
    uVar17 = (this->bcReadInfo).readSequence;
    if (this->IsAllBoardsRev8_9_ == true) {
      local_64 = uVar17 & 0xff;
      uVar9 = uVar9 >> 0x10;
      local_58[uVar20].sequence = uVar9;
      bVar15 = (bool)((byte)(*__s >> 0x17) & 1);
      if (uVar9 != local_64) {
        bVar15 = true;
      }
      local_58[uVar20].seq_error = bVar15;
      local_58[uVar20].blockSize = (uint)(byte)*__s;
      uVar9 = (*pBVar4->_vptr_BoardIO[1])(pBVar4);
      uVar17 = local_64;
      if (pBVar6[uVar20].blockSize != (uVar9 >> 2) + 1) {
        poVar11 = std::operator<<(this->outStr,"BasePort::ReadAllBoardsBroadcast: board ");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        poVar11 = std::operator<<(poVar11,", blockSize = ");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        poVar11 = std::operator<<(poVar11,", expected = ");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::endl<char,std::char_traits<char>>(poVar11);
        uVar17 = local_64;
      }
    }
    else {
      local_58[uVar20].seq_error = uVar10 != uVar17;
      uVar9 = 0x11;
      if (this->IsAllBoardsRev7_ != false) {
        uVar9 = 0x1d;
      }
      local_58[uVar20].blockSize = uVar9;
    }
    if ((this->IsAllBoardsRev7_ == false) && (this->IsAllBoardsRev8_9_ == false)) {
      bVar7 = pBVar6[uVar20].seq_error;
    }
    else {
      dVar21 = (double)(*__s >> 0x18 | (*__s & 0x7f0000) >> 8) * local_70;
      pBVar6[uVar20].updateTime = dVar21;
      bVar7 = pBVar6[uVar20].seq_error;
      if ((bool)bVar7 == false) {
        dVar22 = (this->bcReadInfo).updateFinishTime;
        if (dVar21 < dVar22) {
          dVar21 = dVar21 + *(double *)
                             (&DAT_00118450 + (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8
                             ) * local_70;
          pBVar6[uVar20].updateTime = dVar21;
          (this->bcReadInfo).updateOverflow = true;
        }
        if (dVar21 < (this->bcReadInfo).updateStartTime) {
          (this->bcReadInfo).updateStartTime = dVar21;
        }
        if (dVar22 < dVar21) {
          (this->bcReadInfo).updateFinishTime = dVar21;
        }
      }
    }
    if ((bVar7 & 1) == 0) {
      pBVar4->readValid = true;
      (*pBVar4->_vptr_BoardIO[2])(pBVar4,__s + 1);
      local_60 = 0;
    }
    else {
      poVar11 = std::operator<<(this->outStr,"BasePort::ReadAllBoardsBroadcast: board ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,", seq = ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,", expected = ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,", diff = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar17 - pBVar6[uVar20].sequence);
      std::endl<char,std::char_traits<char>>(poVar11);
      pBVar4->readValid = false;
      pBVar4->numReadErrors = pBVar4->numReadErrors + 1;
      local_68 = 0;
    }
    local_78 = local_78 + 1;
    puVar12 = __s + pBVar6[uVar20].blockSize;
  }
  uVar16 = (ulong)(local_5c + 1);
  __s = puVar12;
  goto LAB_00110019;
}

Assistant:

bool BasePort::ReadAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!CheckFwBusGeneration("ReadAllBoardsBroadcast", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    //--- send out broadcast read request -----

    bool rtRead = true;
    bcReadInfo.IncrementSequence();

    if (!WriteBroadcastReadRequest(bcReadInfo.readSequence)) {
        outStr << "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = "
               << bcReadInfo.readSequence << std::endl;
        OnNoneRead();
        return false;
    }

    // Wait for broadcast read data
    WaitBroadcastRead();

    bcReadInfo.PrepareForRead();

    quadlet_t *hubReadBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
    memset(hubReadBuffer, 0, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    bool ret = ReceiveBroadcastReadResponse(hubReadBuffer, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    if (!ret) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    double clkPeriod = GetBroadcastReadClockPeriod();
    quadlet_t *curPtr = hubReadBuffer;
    unsigned int bdCnt = 0;   // Number of board processed
    // Loop through all boards, processing the boards in use.
    // Note that prior to Firmware Rev 7, we always read data for all 16 boards.
    // Starting with Firmware Rev 9, the board data will generally not be in sequential order
    // (i.e., isBroadcastReadOrdered will return false) for the Ethernet-only interface.
    for (unsigned int index = 0; (index < BoardIO::MAX_BOARDS) && (bdCnt < NumOfBoards_); index++) {
        if ((curPtr[0] == 0) || (curPtr[2] == 0)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid block after reading "
                   << bdCnt << " boards" << std::endl;
            outStr << "Failed to read from board(s) ";
            for (size_t i = 0; i < BoardIO::MAX_BOARDS; i++) {
                if (bcReadInfo.boardInfo[i].inUse && !bcReadInfo.boardInfo[i].updated)
                    outStr << i << " ";
            }
            outStr << std::endl;
            allOK = false;
            break;
        }
        quadlet_t statusQuad = bswap_32(curPtr[2]);
        unsigned int numAxes = (statusQuad&0xf0000000)>>28;
        if (!IsAllBoardsRev8_9_ && (numAxes != 4)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): " << std::hex << statusQuad
                   << std::dec << std::endl;
            allOK = false;
            break;
        }
        unsigned int thisBoard = (statusQuad&0x0f000000)>>24;
        unsigned int boardNum = isBroadcastReadOrdered() ? index : thisBoard;
        BoardIO *board = BoardList[boardNum];
        if (board && (boardNum != thisBoard)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: board mismatch, expecting "
                   << boardNum << ", found " << thisBoard << std::endl;
            allOK = false;
            break;
        }
        if (bcReadInfo.boardInfo[boardNum].inUse && board) {
            bool thisOK = false;
            bcReadInfo.boardInfo[boardNum].updated = true;
            bcReadInfo.boardInfo[boardNum].blockNum = bdCnt++;
            bcReadInfo.boardInfo[boardNum].sequence = bswap_32(curPtr[0]) >> 16;
            unsigned int seq_expected = bcReadInfo.readSequence;
            if (IsAllBoardsRev8_9_) {
                // For Rev 8+, only the LSB of the sequence is returned, but bit 15 also indicates
                // whether the 16-bit sequence number did not match on the FPGA side.
                seq_expected &= 0x00ff;
                bcReadInfo.boardInfo[boardNum].sequence &= 0x00ff;  // lowest byte only
                bcReadInfo.boardInfo[boardNum].seq_error = bswap_32(curPtr[0]) & 0x00008000;  // bit 15
                if (bcReadInfo.boardInfo[boardNum].sequence != seq_expected)
                    bcReadInfo.boardInfo[boardNum].seq_error = true;
                bcReadInfo.boardInfo[boardNum].blockSize = (bswap_32(curPtr[0]) & 0xff000000) >> 24;
                unsigned int bdReadSize = board->GetReadNumBytes()/sizeof(quadlet_t) + 1;
                if (bcReadInfo.boardInfo[boardNum].blockSize != bdReadSize) {
                    outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                           << ", blockSize = " << bcReadInfo.boardInfo[boardNum].blockSize
                           << ", expected = " << bdReadSize << std::endl;
                }
            }
            else {
                bcReadInfo.boardInfo[boardNum].seq_error = (bcReadInfo.boardInfo[boardNum].sequence != seq_expected);
                // Rev7 block size is 29 (1 + 28), Rev4_6 block size is 17 (should have been 21)
                bcReadInfo.boardInfo[boardNum].blockSize = IsAllBoardsRev7_ ? 29 : 17;
            }
            if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
                unsigned int quad0_lsb = bswap_32(curPtr[0])&0x0000ffff;
                bcReadInfo.boardInfo[boardNum].updateTime = (quad0_lsb&0x7fff)*clkPeriod;
                if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                    // Set the update Start/Finish times based on the minimum and maximum update times
                    // Note that update times should be increasing, so if our current updateTime is
                    // less than the previous max (updateFinishTime), then there must have been overflow
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateFinishTime) {
                        // Firmware Rev 9 uses 15 bits; prior versions use 14 bits
                        uint16_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x4000 : 0x8000;
                        bcReadInfo.boardInfo[boardNum].updateTime += overflow_val*clkPeriod;
                        bcReadInfo.updateOverflow = true;
                    }
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateStartTime)
                        bcReadInfo.updateStartTime = bcReadInfo.boardInfo[boardNum].updateTime;
                    if (bcReadInfo.boardInfo[boardNum].updateTime > bcReadInfo.updateFinishTime)
                        bcReadInfo.updateFinishTime = bcReadInfo.boardInfo[boardNum].updateTime;
                }
            }
            if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                thisOK = true;
            }
            else {
                outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                       << ", seq = " << bcReadInfo.boardInfo[boardNum].sequence
                       << ", expected = " << seq_expected
                       << ", diff = " << static_cast<int>(seq_expected-bcReadInfo.boardInfo[boardNum].sequence)
                       << std::endl;
            }
            board->SetReadValid(thisOK);
            if (thisOK) {
                board->SetReadData(curPtr+1);
                noneRead = false;
            }
            else {
                allOK = false;
            }
            curPtr += bcReadInfo.boardInfo[boardNum].blockSize;
        }
        else if (IsAllBoardsRev4_6_) {
            // Skip unused boards for firmware < 7
            // Rev4_6 block size is 17 (should have been 21)
            curPtr += 17;
        }
    }

    if (!allOK) {
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            BoardIO *board = BoardList[bnum];
            if (board && bcReadInfo.boardInfo[bnum].inUse && !bcReadInfo.boardInfo[bnum].updated) {
               board->SetReadValid(false);
            }
        }
        bcReadInfo.readStartTime = 0.0;
        bcReadInfo.readFinishTime = 0.0;
        bcReadInfo.gapTime = 0.0;
    }
    else if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        quadlet_t timingInfo = bswap_32(curPtr[0]);
        bcReadInfo.readStartTime = ((timingInfo&0xffff0000) >> 16)*clkPeriod;
        bcReadInfo.readFinishTime = (timingInfo&0x0000ffff)*clkPeriod;
        if (timingInfo != 0) {
            // timingInfo == 0 indicates invalid data
            if (bcReadInfo.readStartTime < bcReadInfo.updateFinishTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readStartTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
            if (bcReadInfo.readFinishTime < bcReadInfo.readStartTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readFinishTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
        }
        // Gap between end of update and start of read; this can be tuned to be as
        // close to 0 as possible.
        if (timingInfo == 0) {
            bcReadInfo.gapTime = 0.0;
        }
        else {
            bcReadInfo.gapTime = bcReadInfo.readStartTime - bcReadInfo.updateFinishTime;
            if (bcReadInfo.gapTime < bcReadInfo.gapTimeMin)
                bcReadInfo.gapTimeMin = bcReadInfo.gapTime;
            if (bcReadInfo.gapTime > bcReadInfo.gapTimeMax)
                bcReadInfo.gapTimeMax = bcReadInfo.gapTime;
        }
    }

    if (noneRead) {
        OnNoneRead();
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoardsBroadcast: rtRead is false" << std::endl;

#if 0
    if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        bcReadInfo.PrintTiming(outStr);
    }
#endif

    return allOK;
}